

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

uint32_t cab_checksum_cfdata(void *p,size_t bytes,uint32_t seed)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  byte *pbVar5;
  
  if (3 < (uint)bytes) {
    lVar4 = 0;
    do {
      seed = seed ^ *(uint *)((long)p + lVar4 * 4);
      lVar4 = lVar4 + 1;
    } while (((uint)(bytes >> 2) & 0x3fffffff) != (uint)lVar4);
  }
  pbVar5 = (byte *)((long)p + (bytes & 0xfffffffffffffffc));
  uVar3 = 0;
  uVar2 = 0;
  switch((uint)bytes & 3) {
  case 3:
    bVar1 = *pbVar5;
    pbVar5 = pbVar5 + 1;
    uVar2 = (uint)bVar1 << 0x10;
  case 2:
    bVar1 = *pbVar5;
    pbVar5 = pbVar5 + 1;
    uVar3 = uVar2 | (uint)bVar1 << 8;
  case 1:
    uVar3 = uVar3 | *pbVar5;
  case 0:
    return uVar3 ^ seed;
  }
}

Assistant:

static uint32_t
cab_checksum_cfdata(const void *p, size_t bytes, uint32_t seed)
{
	const unsigned char *b;
	uint32_t sum;
	uint32_t t;

	sum = cab_checksum_cfdata_4(p, bytes, seed);
	b = p;
	b += bytes & ~3;
	t = 0;
	switch (bytes & 3) {
	case 3:
		t |= ((uint32_t)(*b++)) << 16;
		/* FALL THROUGH */
	case 2:
		t |= ((uint32_t)(*b++)) << 8;
		/* FALL THROUGH */
	case 1:
		t |= *b;
		/* FALL THROUGH */
	default:
		break;
	}
	sum ^= t;

	return (sum);
}